

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_statements.cpp
# Opt level: O1

ForLoopStatementSyntax * __thiscall
slang::parsing::Parser::parseForLoopStatement
          (Parser *this,NamedLabelSyntax *label,AttrList attributes)

{
  Token openParen;
  Token semi1;
  Token semi2_00;
  bool bVar1;
  int iVar2;
  SyntaxNode *pSVar3;
  ExpressionSyntax *stopExpr;
  ExpressionSyntax *pEVar4;
  StatementSyntax *statement;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ForLoopStatementSyntax *pFVar5;
  SourceLocation SVar6;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *src_00;
  bool bVar7;
  Token TVar8;
  SourceRange range;
  Token TVar9;
  string_view syntaxName;
  Token forKeyword;
  Token semi2;
  SmallVector<slang::syntax::TokenOrSyntax,_4UL> steps;
  SmallVector<slang::syntax::TokenOrSyntax,_4UL> initializers;
  Token local_248;
  Token local_238;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> local_228;
  uint local_218;
  SourceLocation local_210;
  pointer local_208;
  SourceLocation local_200;
  Info *local_1f8;
  undefined8 local_1f0;
  NamedLabelSyntax *local_1e8;
  Info *local_1e0;
  undefined8 local_1d8;
  pointer local_1d0;
  SourceLocation local_1c8;
  Token local_1c0;
  undefined8 local_1b0;
  Info *pIStack_1a8;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> local_1a0;
  ulong local_190;
  undefined1 local_188 [96];
  SeparatedSyntaxList<slang::syntax::SyntaxNode> local_128;
  Token local_f8;
  Token local_e8;
  SmallVectorBase<slang::syntax::TokenOrSyntax> local_d8 [2];
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> local_60;
  
  SVar6 = (SourceLocation)attributes.size_;
  local_1d0 = attributes.data_;
  local_1e8 = label;
  local_1c8 = SVar6;
  TVar8 = ParserBase::consume(&this->super_ParserBase);
  local_1f8 = TVar8.info;
  local_1f0 = TVar8._0_8_;
  TVar8 = ParserBase::expect(&this->super_ParserBase,OpenParenthesis);
  local_1e0 = TVar8.info;
  local_1d8 = TVar8._0_8_;
  Token::Token(&local_248);
  local_d8[0].data_ = (pointer)local_d8[0].firstElement;
  local_d8[0].len = 0;
  local_d8[0].cap = 4;
  bVar1 = isVariableDeclaration(this);
  if (bVar1) {
    TVar8 = ParserBase::peek(&this->super_ParserBase);
    bVar1 = slang::syntax::SyntaxFacts::isEndOfParenList(TVar8.kind);
    if (bVar1) {
      local_248 = ParserBase::expect(&this->super_ParserBase,Semicolon);
    }
    else {
      bVar1 = slang::syntax::SyntaxFacts::isPossibleForInitializer(TVar8.kind);
      if (bVar1) {
        TVar8 = ParserBase::peek(&this->super_ParserBase);
        local_1a0._M_rest =
             (_Variadic_union<const_slang::syntax::SyntaxNode_*>)parseForInitializer(this);
        local_190 = CONCAT71(local_190._1_7_,1);
        SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                  (local_d8,(TokenOrSyntax *)&local_1a0._M_first);
        TVar9 = ParserBase::peek(&this->super_ParserBase);
        bVar1 = slang::syntax::SyntaxFacts::isEndOfParenList(TVar9.kind);
        if (!bVar1) {
          do {
            bVar1 = ParserBase::peek(&this->super_ParserBase,Comma);
            if (!bVar1) break;
            local_1a0._M_first._M_storage =
                 (_Uninitialized<slang::parsing::Token,_true>)
                 ParserBase::expect(&this->super_ParserBase,Comma);
            local_190 = local_190 & 0xffffffffffffff00;
            SmallVectorBase<slang::syntax::TokenOrSyntax>::
            emplace_back<slang::syntax::TokenOrSyntax>
                      (local_d8,(TokenOrSyntax *)&local_1a0._M_first);
            TVar9 = ParserBase::peek(&this->super_ParserBase);
            bVar1 = slang::syntax::SyntaxFacts::isEndOfParenList(TVar9.kind);
            if (bVar1) {
              ParserBase::reportMisplacedSeparator(&this->super_ParserBase);
              break;
            }
            TVar9 = ParserBase::peek(&this->super_ParserBase);
            bVar1 = TVar8.kind == TVar9.kind;
            bVar7 = TVar8.info == TVar9.info;
            SVar6._0_1_ = bVar7 && bVar1;
            if ((bVar7 && bVar1) &&
               (bVar1 = ParserBase::
                        skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleForInitializer,&slang::syntax::SyntaxFacts::isEndOfParenList>
                                  (&this->super_ParserBase,(DiagCode)0x2c0005,true), !bVar1)) break;
            TVar8 = ParserBase::peek(&this->super_ParserBase);
            pSVar3 = parseForInitializer(this);
            local_1a0._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pSVar3;
            local_190 = CONCAT71(local_190._1_7_,1);
            SmallVectorBase<slang::syntax::TokenOrSyntax>::
            emplace_back<slang::syntax::TokenOrSyntax>
                      (local_d8,(TokenOrSyntax *)&local_1a0._M_first);
            TVar9 = ParserBase::peek(&this->super_ParserBase);
            bVar1 = slang::syntax::SyntaxFacts::isEndOfParenList(TVar9.kind);
          } while (!bVar1);
        }
        local_248 = ParserBase::expect(&this->super_ParserBase,Semicolon);
      }
      else {
        SVar6 = (SourceLocation)0x15;
        ParserBase::reportMissingList
                  (&this->super_ParserBase,TVar8,Semicolon,&local_248,(DiagCode)0x2c0005);
      }
    }
  }
  else {
    TVar8 = ParserBase::peek(&this->super_ParserBase);
    bVar1 = slang::syntax::SyntaxFacts::isEndOfParenList(TVar8.kind);
    if (bVar1) {
      local_248 = ParserBase::expect(&this->super_ParserBase,Semicolon);
    }
    else {
      bVar1 = slang::syntax::SyntaxFacts::isPossibleExpressionOrComma(TVar8.kind);
      if (bVar1) {
        do {
          TVar8 = ParserBase::peek(&this->super_ParserBase);
          pSVar3 = &parseExpression(this)->super_SyntaxNode;
          if (pSVar3->kind != AssignmentExpression) {
            if (pSVar3->kind == IdentifierName) {
              TVar9 = slang::syntax::SyntaxNode::getFirstToken(pSVar3);
              if ((TVar9._0_4_ >> 0x10 & 1) != 0) goto LAB_003391e3;
            }
            range = slang::syntax::SyntaxNode::sourceRange(pSVar3);
            SVar6 = range.endLoc;
            ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x580005,range);
          }
LAB_003391e3:
          local_1a0._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pSVar3;
          local_190 = CONCAT71(local_190._1_7_,1);
          SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                    (local_d8,(TokenOrSyntax *)&local_1a0._M_first);
          TVar9 = ParserBase::peek(&this->super_ParserBase);
          bVar1 = slang::syntax::SyntaxFacts::isEndOfParenList(TVar9.kind);
          if ((bVar1) || (bVar1 = ParserBase::peek(&this->super_ParserBase,Comma), !bVar1)) break;
          local_1a0._M_first._M_storage =
               (_Uninitialized<slang::parsing::Token,_true>)
               ParserBase::expect(&this->super_ParserBase,Comma);
          local_190 = local_190 & 0xffffffffffffff00;
          SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                    (local_d8,(TokenOrSyntax *)&local_1a0._M_first);
          TVar9 = ParserBase::peek(&this->super_ParserBase);
          bVar1 = slang::syntax::SyntaxFacts::isEndOfParenList(TVar9.kind);
          if (bVar1) {
            ParserBase::reportMisplacedSeparator(&this->super_ParserBase);
            break;
          }
          TVar9 = ParserBase::peek(&this->super_ParserBase);
          bVar1 = TVar8.kind == TVar9.kind;
          bVar7 = TVar8.info == TVar9.info;
          SVar6._0_1_ = bVar7 && bVar1;
        } while ((!bVar7 || !bVar1) ||
                (bVar1 = ParserBase::
                         skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleExpressionOrComma,&slang::syntax::SyntaxFacts::isEndOfParenList>
                                   (&this->super_ParserBase,(DiagCode)0x2c0005,true), bVar1));
        local_248 = ParserBase::expect(&this->super_ParserBase,Semicolon);
      }
      else {
        SVar6 = (SourceLocation)0x15;
        ParserBase::reportMissingList
                  (&this->super_ParserBase,TVar8,Semicolon,&local_248,(DiagCode)0x2c0005);
      }
    }
  }
  Token::Token(&local_1c0);
  bVar1 = ParserBase::peek(&this->super_ParserBase,Semicolon);
  if (bVar1) {
    local_1c0 = ParserBase::consume(&this->super_ParserBase);
    stopExpr = (ExpressionSyntax *)0x0;
  }
  else {
    stopExpr = parseExpression(this);
    local_1c0 = ParserBase::expect(&this->super_ParserBase,Semicolon);
  }
  Token::Token(&local_238);
  local_1a0._M_first._M_storage.info = (Info *)0x0;
  local_1a0._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)local_188;
  local_190 = 4;
  TVar8 = ParserBase::peek(&this->super_ParserBase);
  bVar1 = slang::syntax::SyntaxFacts::isEndOfParenList(TVar8.kind);
  if (bVar1) {
    local_238 = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
  }
  else {
    bVar1 = slang::syntax::SyntaxFacts::isPossibleExpressionOrComma(TVar8.kind);
    if (bVar1) {
      TVar8 = ParserBase::peek(&this->super_ParserBase);
      local_228._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)parseExpression(this);
      local_218 = CONCAT31(local_218._1_3_,1);
      SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)&local_1a0._M_first,
                 (TokenOrSyntax *)&local_228._M_first);
      TVar9 = ParserBase::peek(&this->super_ParserBase);
      bVar1 = slang::syntax::SyntaxFacts::isEndOfParenList(TVar9.kind);
      if (!bVar1) {
        do {
          bVar1 = ParserBase::peek(&this->super_ParserBase,Comma);
          if (!bVar1) {
            ParserBase::expect(&this->super_ParserBase,Comma);
            do {
              bVar1 = ParserBase::
                      skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleExpressionOrComma,&slang::syntax::SyntaxFacts::isEndOfParenList>
                                (&this->super_ParserBase,(DiagCode)0x10001,false);
              if (!bVar1) {
                local_238 = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
                goto LAB_00339587;
              }
              bVar1 = ParserBase::peek(&this->super_ParserBase,Comma);
            } while (!bVar1);
          }
          local_228._M_first._M_storage =
               (_Uninitialized<slang::parsing::Token,_true>)
               ParserBase::expect(&this->super_ParserBase,Comma);
          local_218 = local_218 & 0xffffff00;
          SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                    ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)&local_1a0._M_first,
                     (TokenOrSyntax *)&local_228._M_first);
          TVar9 = ParserBase::peek(&this->super_ParserBase);
          bVar1 = slang::syntax::SyntaxFacts::isEndOfParenList(TVar9.kind);
          if (bVar1) {
            ParserBase::reportMisplacedSeparator(&this->super_ParserBase);
            break;
          }
          TVar9 = ParserBase::peek(&this->super_ParserBase);
          bVar1 = TVar8.kind == TVar9.kind;
          bVar7 = TVar8.info == TVar9.info;
          SVar6._0_1_ = bVar7 && bVar1;
          if ((bVar7 && bVar1) &&
             (bVar1 = ParserBase::
                      skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleExpressionOrComma,&slang::syntax::SyntaxFacts::isEndOfParenList>
                                (&this->super_ParserBase,(DiagCode)0x10001,true), !bVar1)) break;
          TVar8 = ParserBase::peek(&this->super_ParserBase);
          pEVar4 = parseExpression(this);
          local_228._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pEVar4;
          local_218 = CONCAT31(local_218._1_3_,1);
          SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                    ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)&local_1a0._M_first,
                     (TokenOrSyntax *)&local_228._M_first);
          TVar9 = ParserBase::peek(&this->super_ParserBase);
          bVar1 = slang::syntax::SyntaxFacts::isEndOfParenList(TVar9.kind);
        } while (!bVar1);
      }
      local_238 = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
    }
    else {
      SVar6 = (SourceLocation)0x13;
      ParserBase::reportMissingList
                (&this->super_ParserBase,TVar8,CloseParenthesis,&local_238,(DiagCode)0x10001);
    }
  }
LAB_00339587:
  statement = parseStatement(this,true,false);
  TVar8 = local_238;
  TVar9.info = (Info *)SVar6;
  TVar9.kind = local_238.kind;
  TVar9._2_1_ = local_238._2_1_;
  TVar9.numFlags.raw = local_238.numFlags.raw;
  TVar9.rawLen = local_238.rawLen;
  syntaxName._M_str = "for loop";
  syntaxName._M_len = 8;
  local_238 = TVar8;
  checkEmptyBody(this,&statement->super_SyntaxNode,TVar9,syntaxName);
  local_218 = 1;
  local_210 = local_1c8;
  local_208 = local_1d0;
  local_200 = local_1c8;
  local_228 = (_Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>)
              ZEXT816(0x4ea348);
  local_1b0 = local_1d8;
  pIStack_1a8 = local_1e0;
  iVar2 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                    (local_d8,(EVP_PKEY_CTX *)(this->super_ParserBase).alloc,src);
  TVar9 = local_1c0;
  TVar8 = local_248;
  local_128.elements.data_ = (pointer)CONCAT44(extraout_var,iVar2);
  local_128.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
  local_128.super_SyntaxListBase.super_SyntaxNode.kind = SeparatedList;
  local_128.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_004ed540;
  local_e8.kind = local_248.kind;
  local_e8._2_1_ = local_248._2_1_;
  local_e8.numFlags.raw = local_248.numFlags.raw;
  local_e8.rawLen = local_248.rawLen;
  local_e8.info = local_248.info;
  local_f8.kind = local_1c0.kind;
  local_f8._2_1_ = local_1c0._2_1_;
  local_f8.numFlags.raw = local_1c0.numFlags.raw;
  local_f8.rawLen = local_1c0.rawLen;
  local_f8.info = local_1c0.info;
  local_248 = TVar8;
  local_1c0 = TVar9;
  iVar2 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                    ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)&local_1a0._M_first,
                     (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,src_00);
  local_60.elements.data_ = (pointer)CONCAT44(extraout_var_00,iVar2);
  local_60.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
  local_60.super_SyntaxListBase.super_SyntaxNode.kind = SeparatedList;
  local_60.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_004ed090;
  openParen.info = pIStack_1a8;
  openParen.kind = (undefined2)local_1b0;
  openParen._2_1_ = local_1b0._2_1_;
  openParen.numFlags.raw = local_1b0._3_1_;
  openParen.rawLen = local_1b0._4_4_;
  semi1.info = local_e8.info;
  semi1.kind = local_e8.kind;
  semi1._2_1_ = local_e8._2_1_;
  semi1.numFlags.raw = local_e8.numFlags.raw;
  semi1.rawLen = local_e8.rawLen;
  semi2_00.info = local_f8.info;
  semi2_00.kind = local_f8.kind;
  semi2_00._2_1_ = local_f8._2_1_;
  semi2_00.numFlags.raw = local_f8.numFlags.raw;
  semi2_00.rawLen = local_f8.rawLen;
  forKeyword.info = local_1f8;
  forKeyword.kind = (undefined2)local_1f0;
  forKeyword._2_1_ = local_1f0._2_1_;
  forKeyword.numFlags.raw = local_1f0._3_1_;
  forKeyword.rawLen = local_1f0._4_4_;
  pFVar5 = slang::syntax::SyntaxFactory::forLoopStatement
                     (&this->factory,local_1e8,
                      (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)&local_228._M_first,
                      forKeyword,openParen,&local_128,semi1,stopExpr,semi2_00,&local_60,local_238,
                      statement);
  if (local_1a0._M_rest != (_Variadic_union<const_slang::syntax::SyntaxNode_*>)local_188) {
    free((void *)local_1a0._M_rest);
  }
  if (local_d8[0].data_ != (pointer)local_d8[0].firstElement) {
    free(local_d8[0].data_);
  }
  return pFVar5;
}

Assistant:

ForLoopStatementSyntax& Parser::parseForLoopStatement(NamedLabelSyntax* label,
                                                      AttrList attributes) {
    auto forKeyword = consume();
    auto openParen = expect(TokenKind::OpenParenthesis);

    Token semi1;
    SmallVector<TokenOrSyntax, 4> initializers;

    if (isVariableDeclaration()) {
        parseList<isPossibleForInitializer, isEndOfParenList>(
            initializers, TokenKind::Semicolon, TokenKind::Comma, semi1, RequireItems::False,
            diag::ExpectedForInitializer, [this] { return &parseForInitializer(); });
    }
    else {
        parseList<isPossibleExpressionOrComma, isEndOfParenList>(
            initializers, TokenKind::Semicolon, TokenKind::Comma, semi1, RequireItems::False,
            diag::ExpectedForInitializer, [this] {
                auto& expr = parseExpression();
                if (expr.kind != SyntaxKind::AssignmentExpression &&
                    (expr.kind != SyntaxKind::IdentifierName ||
                     !expr.getFirstToken().isMissing())) {
                    // Initializer expressions must be variable assignments.
                    addDiag(diag::InvalidForInitializer, expr.sourceRange());
                }
                return &expr;
            });
    }

    ExpressionSyntax* stopExpr = nullptr;
    Token semi2;
    if (peek(TokenKind::Semicolon)) {
        semi2 = consume();
    }
    else {
        stopExpr = &parseExpression();
        semi2 = expect(TokenKind::Semicolon);
    }

    Token closeParen;
    SmallVector<TokenOrSyntax, 4> steps;
    parseList<isPossibleExpressionOrComma, isEndOfParenList>(
        steps, TokenKind::CloseParenthesis, TokenKind::Comma, closeParen, RequireItems::False,
        diag::ExpectedExpression, [this] { return &parseExpression(); });

    auto& body = parseStatement();

    checkEmptyBody(body, closeParen, "for loop"sv);

    return factory.forLoopStatement(label, attributes, forKeyword, openParen,
                                    initializers.copy(alloc), semi1, stopExpr, semi2,
                                    steps.copy(alloc), closeParen, body);
}